

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

vec4 dja::operator*(mat4 *m,vec4 *a)

{
  float_t fVar1;
  float_t fVar2;
  float_t fVar3;
  vec4 vVar4;
  
  vVar4.x = dot(m->m,a);
  fVar1 = dot(m->m + 1,a);
  fVar2 = dot(m->m + 2,a);
  fVar3 = dot(m->m + 3,a);
  vVar4.w = fVar3;
  vVar4.z = fVar2;
  vVar4.y = fVar1;
  return vVar4;
}

Assistant:

vec4 operator*(const mat4& m, const vec4& a)
{
    return vec4(dot(m[0], a), dot(m[1], a), dot(m[2], a), dot(m[3], a));
}